

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void __thiscall QDateTime::QDateTime(QDateTime *this,QDateTime *other)

{
  uint uVar1;
  QDateTimePrivate *pQVar2;
  
  pQVar2 = (other->d).d;
  (this->d).d = pQVar2;
  if (((ulong)pQVar2 & 1) == 0) {
    uVar1 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    if (((uVar1 & 0x20) == 0) && (pQVar2->m_msecs + 0x80000000000000U >> 0x38 == 0)) {
      (this->d).d = (QDateTimePrivate *)((ulong)(uVar1 & 0xde) + pQVar2->m_msecs * 0x100 + 1);
      return;
    }
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  return;
}

Assistant:

inline QDateTime::Data::Data(const Data &other) noexcept
    : data(other.data)
{
    if (!isShort()) {
        // check if we could shrink
        if (specCanBeSmall(extractSpec(d->m_status)) && msecsCanBeSmall(d->m_msecs)) {
            ShortData sd;
            sd.msecs = qintptr(d->m_msecs);
            sd.status = (d->m_status | QDateTimePrivate::ShortData).toInt();
            data = sd;
        } else {
            // no, have to keep it big
            d->ref.ref();
        }
    }
}